

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd_tga.c
# Opt level: O3

int read_image_tga(gdIOCtx *ctx,oTga *tga)

{
  byte bVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  size_t size;
  int *piVar5;
  void *ptr;
  void *buf;
  int iVar6;
  ulong uVar7;
  uint a;
  uint uVar8;
  int iVar9;
  uint uVar10;
  
  bVar1 = tga->bits;
  iVar3 = overflow2(tga->width,tga->height);
  if (iVar3 != 0) {
    return -1;
  }
  uVar10 = (uint)(bVar1 >> 3);
  iVar3 = overflow2(tga->height * tga->width,uVar10);
  if (iVar3 != 0) {
    return -1;
  }
  a = tga->width * uVar10 * tga->height;
  iVar3 = overflow2(a,4);
  if (iVar3 != 0) {
    return -1;
  }
  if ((tga->imagetype | 8) != 10) {
    return -1;
  }
  size = (size_t)(int)a;
  piVar5 = (int *)gdMalloc(size * 4);
  tga->bitmap = piVar5;
  if (piVar5 == (int *)0x0) {
    return -1;
  }
  if (tga->imagetype == '\n') {
    ptr = gdMalloc(size * 4);
    if (ptr == (void *)0x0) {
      return -1;
    }
    buf = gdMalloc(size);
    if (buf == (void *)0x0) {
      gd_error("gd-tga: premature end of image data\n");
    }
    else {
      uVar4 = gdGetBuf(buf,a,ctx);
      if (0 < (int)uVar4) {
        uVar7 = 0;
        do {
          *(uint *)((long)ptr + uVar7 * 4) = (uint)*(byte *)((long)buf + uVar7);
          uVar7 = uVar7 + 1;
        } while (uVar4 != uVar7);
        if (0 < (int)a) {
          uVar8 = 0;
          iVar3 = 0;
          do {
            if ((int)uVar4 < (int)(iVar3 + uVar10)) {
LAB_0011e3de:
              gdFree(ptr);
              iVar3 = -1;
              ptr = buf;
              goto LAB_0011e3d4;
            }
            uVar2 = *(uint *)((long)ptr + (long)iVar3 * 4);
            if ((char)uVar2 < '\0') {
              iVar9 = (uVar2 & 0xffffff7f) + 1;
              if ((int)(iVar9 * uVar10 + uVar8) <= (int)a) {
                iVar6 = iVar3 + 1;
                iVar3 = iVar6 + uVar10;
                if (iVar3 <= (int)uVar4) {
                  if ((int)uVar2 < 0) {
                    uVar7 = (ulong)uVar8;
                  }
                  else {
                    uVar7 = (ulong)(int)uVar8;
                    do {
                      memcpy(tga->bitmap + uVar7,(void *)((long)ptr + (long)iVar6 * 4),
                             (ulong)(uVar10 * 4));
                      uVar7 = uVar7 + (bVar1 >> 3);
                      iVar9 = iVar9 + -1;
                    } while (iVar9 != 0);
                  }
                  uVar8 = (uint)uVar7;
                  goto LAB_0011e375;
                }
              }
              goto LAB_0011e3de;
            }
            iVar9 = (uVar2 + 1) * uVar10;
            if ((int)a < (int)(iVar9 + uVar8)) {
LAB_0011e3f3:
              gdFree(ptr);
              iVar3 = -1;
              ptr = buf;
              goto LAB_0011e3d4;
            }
            iVar6 = iVar3 + 1;
            iVar3 = iVar9 + iVar6;
            if ((int)uVar4 < iVar3) goto LAB_0011e3f3;
            memcpy(tga->bitmap + (int)uVar8,(void *)((long)ptr + (long)iVar6 * 4),(long)iVar9 << 2);
            uVar8 = iVar9 + uVar8;
LAB_0011e375:
          } while ((int)uVar8 < (int)a);
        }
        gdFree(ptr);
        iVar3 = 1;
        ptr = buf;
        goto LAB_0011e3d4;
      }
      gdFree(buf);
    }
    iVar3 = -1;
  }
  else {
    if (tga->imagetype != '\x02') {
      return 1;
    }
    ptr = gdMalloc(size);
    if (ptr == (void *)0x0) {
      return -1;
    }
    uVar10 = gdGetBuf(ptr,a,ctx);
    if (uVar10 == a) {
      iVar3 = 1;
      if (0 < (int)a) {
        piVar5 = tga->bitmap;
        uVar7 = 0;
        do {
          piVar5[uVar7] = (uint)*(byte *)((long)ptr + uVar7);
          uVar7 = uVar7 + 1;
        } while (a != uVar7);
      }
    }
    else {
      gd_error("gd-tga: premature end of image data\n");
      iVar3 = -1;
    }
  }
LAB_0011e3d4:
  gdFree(ptr);
  return iVar3;
}

Assistant:

int read_image_tga( gdIOCtx *ctx, oTga *tga )
{
	int pixel_block_size = (tga->bits / 8);
	int image_block_size;
	int* decompression_buffer = NULL;
	unsigned char* conversion_buffer = NULL;
	int buffer_caret = 0;
	int bitmap_caret = 0;
	int i = 0;
	int encoded_pixels;
	int rle_size;

	if(overflow2(tga->width, tga->height)) {
		return -1;
	}

	if(overflow2(tga->width * tga->height, pixel_block_size)) {
		return -1;
	}

	image_block_size = (tga->width * tga->height) * pixel_block_size;
	if(overflow2(image_block_size, sizeof(int))) {
		return -1;
	}

	/*! \todo Add more image type support.
	 */
	if (tga->imagetype != TGA_TYPE_RGB && tga->imagetype != TGA_TYPE_RGB_RLE)
		return -1;

	/*!	\brief Allocate memmory for image block
	 *  Allocate a chunk of memory for the image block to be passed into.
	 */
	tga->bitmap = (int *) gdMalloc(image_block_size * sizeof(int));
	if (tga->bitmap == NULL)
		return -1;

	switch (tga->imagetype) {
	case TGA_TYPE_RGB:
		/*! \brief Read in uncompressed RGB TGA
		 *  Chunk load the pixel data from an uncompressed RGB type TGA.
		 */
		conversion_buffer = (unsigned char *) gdMalloc(image_block_size * sizeof(unsigned char));
		if (conversion_buffer == NULL) {
			return -1;
		}

		if (gdGetBuf(conversion_buffer, image_block_size, ctx) != image_block_size) {
			gd_error("gd-tga: premature end of image data\n");
			gdFree(conversion_buffer);
			return -1;
		}

		while (buffer_caret < image_block_size) {
			tga->bitmap[buffer_caret] = (int) conversion_buffer[buffer_caret];
			buffer_caret++;
		}

		gdFree(conversion_buffer);
		break;

	case TGA_TYPE_RGB_RLE:
		/*! \brief Read in RLE compressed RGB TGA
		 *  Chunk load the pixel data from an RLE compressed RGB type TGA.
		 */
		decompression_buffer = (int*) gdMalloc(image_block_size * sizeof(int));
		if (decompression_buffer == NULL) {
			return -1;
		}
		conversion_buffer = (unsigned char *) gdMalloc(image_block_size * sizeof(unsigned char));
		if (conversion_buffer == NULL) {
			gd_error("gd-tga: premature end of image data\n");
			gdFree( decompression_buffer );
			return -1;
		}

		rle_size = gdGetBuf(conversion_buffer, image_block_size, ctx);
		if (rle_size <= 0) {
			gdFree(conversion_buffer);
			gdFree(decompression_buffer);
			return -1;
		}

		buffer_caret = 0;

		while( buffer_caret < rle_size) {
			decompression_buffer[buffer_caret] = (int)conversion_buffer[buffer_caret];
			buffer_caret++;
		}

		buffer_caret = 0;

		while( bitmap_caret < image_block_size ) {

			if (buffer_caret + pixel_block_size > rle_size) {
				gdFree( decompression_buffer );
				gdFree( conversion_buffer );
				return -1;
			}

			if ((decompression_buffer[buffer_caret] & TGA_RLE_FLAG) == TGA_RLE_FLAG) {
				encoded_pixels = ( ( decompression_buffer[ buffer_caret ] & ~TGA_RLE_FLAG ) + 1 );
				buffer_caret++;

				if ((bitmap_caret + (encoded_pixels * pixel_block_size)) > image_block_size
						|| buffer_caret + pixel_block_size > rle_size) {
					gdFree( decompression_buffer );
					gdFree( conversion_buffer );
					return -1;
				}

				for (i = 0; i < encoded_pixels; i++) {
					memcpy(tga->bitmap + bitmap_caret, decompression_buffer + buffer_caret, pixel_block_size * sizeof(int));
					bitmap_caret += pixel_block_size;
				}
				buffer_caret += pixel_block_size;

			} else {
				encoded_pixels = decompression_buffer[ buffer_caret ] + 1;
				buffer_caret++;

				if ((bitmap_caret + (encoded_pixels * pixel_block_size)) > image_block_size
						|| buffer_caret + (encoded_pixels * pixel_block_size) > rle_size) {
					gdFree( decompression_buffer );
					gdFree( conversion_buffer );
					return -1;
				}

				memcpy(tga->bitmap + bitmap_caret, decompression_buffer + buffer_caret, encoded_pixels * pixel_block_size * sizeof(int));
				bitmap_caret += (encoded_pixels * pixel_block_size);
				buffer_caret += (encoded_pixels * pixel_block_size);
			}
		}
		gdFree( decompression_buffer );
		gdFree( conversion_buffer );
		break;
	}

	return 1;
}